

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O3

int Abc_CommandInvPrint(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint fVerbose;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar1 != 0x76) break;
    fVerbose = fVerbose ^ 1;
  }
  if (iVar1 == -1) {
    if (pAbc->pAbcWlcInv == (Vec_Int_t *)0x0) {
      iVar1 = 0;
      Abc_Print(1,"Abc_CommandInvPs(): Invariant is not available.\n");
    }
    else {
      Pdr_InvPrint(pAbc->pAbcWlcInv,fVerbose);
      iVar1 = 0;
    }
  }
  else {
    Abc_Print(-2,"usage: inv_print [-vh]\n");
    Abc_Print(-2,"\t         prints the current inductive invariant\n");
    Abc_Print(-2,"\t         (in the case of \'sat\' or \'undecided\', inifity clauses are used)\n")
    ;
    pcVar2 = "yes";
    if (fVerbose == 0) {
      pcVar2 = "no";
    }
    Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Abc_CommandInvPrint( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Pdr_InvPrint( Vec_Int_t * vInv, int fVerbose );
    int c, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( Wlc_AbcGetInv(pAbc) == NULL )
    {
        Abc_Print( 1, "Abc_CommandInvPs(): Invariant is not available.\n" );
        return 0;
    }
    Pdr_InvPrint( Wlc_AbcGetInv(pAbc), fVerbose );
    return 0;
usage:
    Abc_Print( -2, "usage: inv_print [-vh]\n" );
    Abc_Print( -2, "\t         prints the current inductive invariant\n" );
    Abc_Print( -2, "\t         (in the case of \'sat\' or \'undecided\', inifity clauses are used)\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}